

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

void __thiscall
icu_63::MessagePattern::addPart
          (MessagePattern *this,UMessagePatternPartType type,int32_t index,int32_t length,
          int32_t value,UErrorCode *errorCode)

{
  int iVar1;
  Part *pPVar2;
  UBool UVar3;
  
  UVar3 = MessagePatternList<icu_63::MessagePattern::Part,_32>::ensureCapacityForOneMore
                    (&this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>,
                     this->partsLength,errorCode);
  if (UVar3 != '\0') {
    iVar1 = this->partsLength;
    this->partsLength = iVar1 + 1;
    pPVar2 = (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr;
    pPVar2[iVar1].type = type;
    pPVar2[iVar1].index = index;
    pPVar2[iVar1].length = (uint16_t)length;
    pPVar2[iVar1].value = (int16_t)value;
    pPVar2[iVar1].limitPartIndex = 0;
  }
  return;
}

Assistant:

void
MessagePattern::addPart(UMessagePatternPartType type, int32_t index, int32_t length,
                        int32_t value, UErrorCode &errorCode) {
    if(partsList->ensureCapacityForOneMore(partsLength, errorCode)) {
        Part &part=partsList->a[partsLength++];
        part.type=type;
        part.index=index;
        part.length=(uint16_t)length;
        part.value=(int16_t)value;
        part.limitPartIndex=0;
    }
}